

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O3

void glu::TextureTestUtil::sampleTexture
               (SurfaceAccess *dst,TextureCubeView *src,float *texCoord,ReferenceParams *params)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  undefined8 uVar7;
  byte bVar8;
  bool bVar9;
  undefined1 auVar10 [16];
  ulong uVar11;
  int iVar12;
  uint uVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int faceSize;
  int iVar17;
  int iVar18;
  uint uVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  Vec3 triR [2];
  Vec3 triT [2];
  Vec3 triS [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  TextureCubeView src_1;
  TextureCubeView view;
  float local_204;
  Vec3 local_200;
  float local_1f4;
  float local_1f0;
  float local_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  float local_1c8 [8];
  float local_1a8 [8];
  float local_188 [8];
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  undefined4 uStack_154;
  undefined4 uStack_150;
  undefined4 uStack_14c;
  undefined1 local_148 [4];
  undefined8 uStack_144;
  float fStack_13c;
  ConstPixelBufferAccess *local_138;
  float local_130;
  ConstPixelBufferAccess *local_128;
  float local_120;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_118;
  float local_f8;
  undefined8 uStack_f4;
  float fStack_ec;
  undefined8 local_e8;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  undefined1 local_a0 [56];
  TextureCubeView local_68;
  
  getSubView(&local_68,src,params->baseLevel,params->maxLevel);
  fVar20 = *texCoord;
  local_1d8 = CONCAT44(local_1d8._4_4_,texCoord[1]);
  fVar21 = texCoord[3];
  fVar22 = texCoord[6];
  local_168 = texCoord[9];
  _local_1e8 = CONCAT44(fStack_1e4,texCoord[4]);
  fVar33 = texCoord[7];
  local_158 = texCoord[10];
  fVar24 = texCoord[2];
  fVar26 = texCoord[5];
  fVar27 = texCoord[8];
  fVar28 = texCoord[0xb];
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_118.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  tcu::getEffectiveTextureView((TextureCubeView *)local_a0,&local_68,&local_118,&params->sampler);
  if ((int)local_a0._0_4_ < 1) {
    faceSize = 0;
  }
  else {
    faceSize = ((IVec3 *)(local_a0._8_8_ + 8))->m_data[0];
  }
  iVar12 = dst->m_width;
  iVar18 = dst->m_height;
  local_188[0] = fVar20;
  local_188[1] = fVar21;
  local_188[2] = fVar22;
  local_188[3] = local_168;
  local_188[4] = fVar22;
  local_188[5] = fVar21;
  local_1a8[0] = (float)local_1d8;
  local_1a8[1] = local_1e8;
  local_1a8[2] = fVar33;
  local_1a8[3] = local_158;
  local_1a8[4] = fVar33;
  local_1a8[5] = local_1e8;
  local_1c8[0] = fVar24;
  local_1c8[1] = fVar26;
  local_1c8[2] = fVar27;
  local_1c8[3] = fVar28;
  local_1c8[4] = fVar27;
  local_1c8[5] = fVar26;
  uStack_f4._0_4_ = (params->super_RenderParams).w.m_data[1];
  uStack_f4._4_4_ = (params->super_RenderParams).w.m_data[2];
  local_f8 = (params->super_RenderParams).w.m_data[0];
  fStack_ec = (params->super_RenderParams).w.m_data[3];
  local_e8 = CONCAT44((float)uStack_f4,uStack_f4._4_4_);
  local_204 = 0.0;
  if (((params->super_RenderParams).flags & 2) != 0) {
    local_204 = (params->super_RenderParams).bias;
  }
  if (0 < iVar18) {
    fVar20 = (float)iVar12;
    fVar21 = (float)iVar18;
    iVar17 = 0;
    do {
      if (0 < iVar12) {
        fVar22 = (float)iVar17 + 0.5;
        local_1f0 = fVar22 / fVar21;
        local_1f4 = 1.0 - local_1f0;
        iVar18 = 0;
        do {
          fVar33 = (float)iVar18 + 0.5;
          local_158 = fVar33 / fVar20;
          bVar9 = 1.0 <= local_1f0 + local_158;
          local_d8 = local_1f0;
          if (bVar9) {
            local_158 = 1.0 - local_158;
            local_d8 = local_1f4;
          }
          uVar11 = (ulong)bVar9;
          fVar24 = local_1c8[uVar11 * 3];
          fVar26 = local_1c8[uVar11 * 3 + 1];
          fVar27 = local_1c8[uVar11 * 3 + 2];
          local_200.m_data[2] =
               (fVar26 - fVar24) * local_d8 + (fVar27 - fVar24) * local_158 + fVar24;
          fVar28 = local_1a8[uVar11 * 3];
          fVar1 = local_1a8[uVar11 * 3 + 1];
          uStack_154 = 0;
          uStack_150 = 0;
          uStack_14c = 0;
          fVar2 = local_1a8[uVar11 * 3 + 2];
          fVar3 = local_188[uVar11 * 3];
          fVar4 = local_188[uVar11 * 3 + 1];
          fVar5 = local_188[uVar11 * 3 + 2];
          local_1d8 = CONCAT44(fVar2,fVar5);
          uStack_1d0 = 0;
          uVar7 = *(undefined8 *)((long)&uStack_f4 + uVar11 * 0xc);
          fVar31 = (float)uVar7;
          fVar32 = (float)((ulong)uVar7 >> 0x20);
          local_168 = (fVar3 - fVar5) * fVar31;
          fStack_164 = (fVar28 - fVar2) * fVar31;
          fStack_160 = fVar31 * 0.0;
          fStack_15c = fVar31 * 0.0;
          local_c8 = fVar31 * (fVar5 - fVar3);
          fStack_c4 = fVar31 * (fVar2 - fVar28);
          fStack_c0 = fVar31 * 0.0;
          fStack_bc = fVar31 * 0.0;
          local_200.m_data[1] = (fVar1 - fVar28) * local_d8 + (fVar2 - fVar28) * local_158 + fVar28;
          local_200.m_data[0] = (fVar4 - fVar3) * local_d8 + (fVar5 - fVar3) * local_158 + fVar3;
          fVar34 = local_d8 + -1.0;
          local_1ec = fVar33 * fVar31;
          fVar6 = (&local_f8)[uVar11 * 3];
          fVar36 = fVar31 * fVar6 * fVar32;
          fVar23 = (fVar3 - fVar4) * fVar32;
          fVar25 = (fVar28 - fVar1) * fVar32;
          _local_1e8 = CONCAT44(fVar25,fVar23);
          _fStack_1e0 = CONCAT44(fVar32 * 0.0,fVar32 * 0.0);
          fVar35 = (fVar20 * fVar34 + fVar33) * fVar31 * fVar32 -
                   (fVar32 * fVar20 * local_d8 + local_1ec) * fVar6;
          fVar33 = fVar36 * fVar20;
          auVar29._0_4_ =
               fVar33 * (fVar34 * local_168 +
                        ((fVar4 - fVar3) * fVar32 + (fVar5 - fVar4) * fVar6) * local_d8);
          auVar29._4_4_ =
               fVar33 * (fVar34 * fStack_164 +
                        ((fVar1 - fVar28) * fVar32 + (fVar2 - fVar1) * fVar6) * local_d8);
          auVar29._8_4_ = fVar32 * (fStack_160 * 0.0 + (fVar32 * 0.0 + fVar6 * 0.0) * local_d8);
          auVar29._12_4_ = fVar32 * (fStack_15c * 0.0 + (fVar32 * 0.0 + fVar6 * 0.0) * local_d8);
          fVar35 = fVar35 * fVar35;
          local_120 = (((fVar24 - fVar27) * fVar31 * fVar34 +
                       ((fVar26 - fVar24) * fVar32 + (fVar27 - fVar26) * fVar6) * local_d8) * fVar33
                      ) / fVar35;
          auVar10._4_4_ = fVar35;
          auVar10._0_4_ = fVar35;
          auVar10._8_8_ = 0;
          auVar30 = divps(auVar29,auVar10);
          local_128 = auVar30._0_8_;
          fVar28 = local_158 + -1.0;
          fVar33 = (fVar21 * fVar28 + fVar22) * fVar31 * fVar32 -
                   (fVar31 * fVar21 * local_158 + fVar22 * fVar32) * fVar6;
          fVar36 = fVar36 * fVar21;
          auVar37._0_4_ =
               fVar36 * (fVar28 * fVar23 + ((fVar4 - fVar5) * fVar6 + local_c8) * local_158);
          auVar37._4_4_ =
               fVar36 * (fVar28 * fVar25 + ((fVar1 - fVar2) * fVar6 + fStack_c4) * local_158);
          auVar37._8_4_ = fVar32 * (fVar32 * 0.0 * 0.0 + (fVar6 * 0.0 + fStack_c0) * local_158);
          auVar37._12_4_ = fVar32 * (fVar32 * 0.0 * 0.0 + (fVar6 * 0.0 + fStack_bc) * local_158);
          fVar33 = fVar33 * fVar33;
          local_130 = (((fVar24 - fVar26) * fVar32 * fVar28 +
                       ((fVar26 - fVar27) * fVar6 + (fVar27 - fVar24) * fVar31) * local_158) *
                      fVar36) / fVar33;
          auVar30._4_4_ = fVar33;
          auVar30._0_4_ = fVar33;
          auVar30._8_8_ = 0;
          auVar30 = divps(auVar37,auVar30);
          local_138 = auVar30._0_8_;
          fStack_d4 = local_d8;
          fStack_d0 = local_d8;
          fStack_cc = local_d8;
          local_b8 = local_158;
          fStack_b4 = local_158;
          fStack_b0 = local_158;
          fStack_ac = local_158;
          fVar24 = computeCubeLodFromDerivates
                             (params->lodMode,&local_200,(Vec3 *)&local_128,(Vec3 *)&local_138,
                              faceSize);
          fVar24 = fVar24 + local_204;
          fVar33 = params->maxLod;
          if (fVar24 <= params->maxLod) {
            fVar33 = fVar24;
          }
          uVar19 = -(uint)(fVar24 < params->minLod);
          fVar33 = (float)(uVar19 & (uint)params->minLod | ~uVar19 & (uint)fVar33);
          if ((params->super_RenderParams).samplerType == SAMPLERTYPE_SHADOW) {
            local_148 = (undefined1  [4])
                        tcu::TextureCubeView::sampleCompare
                                  ((TextureCubeView *)local_a0,&params->sampler,
                                   (params->super_RenderParams).ref,local_200.m_data[0],
                                   local_200.m_data[1],local_200.m_data[2],fVar33);
            uStack_144 = 0;
            fStack_13c = 1.0;
          }
          else {
            tcu::TextureCubeView::sample
                      ((TextureCubeView *)local_148,(Sampler *)local_a0,local_200.m_data[0],
                       local_200.m_data[1],local_200.m_data[2],fVar33);
          }
          fVar33 = (params->super_RenderParams).colorScale.m_data[0] * (float)local_148 +
                   (params->super_RenderParams).colorBias.m_data[0];
          fVar24 = (params->super_RenderParams).colorScale.m_data[1] * (float)uStack_144 +
                   (params->super_RenderParams).colorBias.m_data[1];
          fVar26 = (params->super_RenderParams).colorScale.m_data[2] * uStack_144._4_4_ +
                   (params->super_RenderParams).colorBias.m_data[2];
          fVar27 = (params->super_RenderParams).colorScale.m_data[3] * fStack_13c +
                   (params->super_RenderParams).colorBias.m_data[3];
          bVar8 = dst->m_colorMask;
          uVar13 = 0;
          uVar19 = 0;
          if ((bVar8 & 1) != 0) {
            uVar14 = 0x7e - ((int)fVar33 >> 0x17);
            uVar19 = (((uint)fVar33 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                     0x800000;
            if (8 < uVar14) {
              uVar19 = uVar14;
            }
            uVar19 = uVar19 >> 0x18;
          }
          if ((bVar8 & 2) != 0) {
            uVar14 = 0x7e - ((int)fVar24 >> 0x17);
            uVar13 = (((uint)fVar24 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar14 & 0x1f)) +
                     0x800000;
            if (8 < uVar14) {
              uVar13 = uVar14;
            }
            uVar13 = uVar13 >> 0x10 & 0xff00;
          }
          uVar14 = 0;
          if ((bVar8 & 4) != 0) {
            uVar15 = 0x7e - ((int)fVar26 >> 0x17);
            uVar14 = (((uint)fVar26 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar15 & 0x1f)) +
                     0x800000;
            if (8 < uVar15) {
              uVar14 = uVar15;
            }
            uVar14 = uVar14 >> 8 & 0xff0000;
          }
          uVar15 = 0xff000000;
          if ((bVar8 & 8) != 0) {
            uVar16 = 0x7e - ((int)fVar27 >> 0x17);
            uVar15 = (((uint)fVar27 & 0x7fffff) * 0xff + 0x7f800000 >> ((byte)uVar16 & 0x1f)) +
                     0x800000;
            if (8 < uVar16) {
              uVar15 = uVar16;
            }
            uVar15 = uVar15 & 0xff000000;
          }
          *(uint *)((long)(dst->m_surface->m_pixels).m_ptr +
                   (long)(dst->m_x + iVar18 + (dst->m_y + iVar17) * dst->m_surface->m_width) * 4) =
               uVar13 | uVar19 | uVar14 | uVar15;
          iVar18 = iVar18 + 1;
          iVar12 = dst->m_width;
        } while (iVar18 < iVar12);
        iVar18 = dst->m_height;
      }
      iVar17 = iVar17 + 1;
    } while (iVar17 < iVar18);
  }
  if (local_118.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_118.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_118.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_118.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void sampleTexture (const tcu::SurfaceAccess& dst, const tcu::TextureCubeView& src, const float* texCoord, const ReferenceParams& params)
{
	const tcu::TextureCubeView	view	= getSubView(src, params.baseLevel, params.maxLevel);
	const tcu::Vec4				sq		= tcu::Vec4(texCoord[0+0], texCoord[3+0], texCoord[6+0], texCoord[9+0]);
	const tcu::Vec4				tq		= tcu::Vec4(texCoord[0+1], texCoord[3+1], texCoord[6+1], texCoord[9+1]);
	const tcu::Vec4				rq		= tcu::Vec4(texCoord[0+2], texCoord[3+2], texCoord[6+2], texCoord[9+2]);

	return sampleTextureCube(dst, view, sq, tq, rq, params);
}